

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset_Test::TestBody
          (CoinSelection_SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  char *in_R9;
  Amount AVar4;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  bool use_bnb;
  Amount tx_fee;
  Amount fee;
  Amount select_value;
  Amount target_amount;
  bool *in_stack_fffffffffffffd08;
  AssertionResult *in_stack_fffffffffffffd10;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffd18;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  string local_270;
  AssertHelper local_250;
  Message local_248;
  byte local_239;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220;
  undefined8 local_218;
  AssertionResult local_210;
  AssertHelper local_200;
  Message local_1f8;
  undefined8 local_1f0;
  AssertionResult local_1e8;
  AssertHelper local_1d8;
  Message local_1d0;
  undefined4 local_1c4;
  int64_t local_1c0;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined4 local_194;
  int64_t local_190;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  undefined4 local_164;
  size_type local_160;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140 [2];
  char local_130 [24];
  CoinSelectionOption *in_stack_fffffffffffffee8;
  UtxoFilter *in_stack_fffffffffffffef0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffef8;
  Amount *in_stack_ffffffffffffff00;
  CoinSelection *in_stack_ffffffffffffff08;
  Amount *in_stack_ffffffffffffff20;
  Amount *in_stack_ffffffffffffff28;
  Amount *in_stack_ffffffffffffff30;
  bool *in_stack_ffffffffffffff38;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_88;
  undefined1 local_69 [17];
  int64_t local_58;
  undefined1 local_50;
  undefined1 local_48 [32];
  int64_t local_28;
  undefined1 local_20;
  int64_t local_18;
  undefined1 local_10;
  
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(220000000);
  local_28 = AVar4.amount_;
  local_20 = AVar4.ignore_check_;
  local_18 = local_28;
  local_10 = local_20;
  cfd::core::Amount::Amount((Amount *)(local_48 + 0x10));
  cfd::core::Amount::Amount((Amount *)local_48);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_69._1_8_ = AVar4.amount_;
  local_69[9] = AVar4.ignore_check_;
  local_69[0] = 0;
  local_58 = local_69._1_8_;
  local_50 = local_69[9];
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x25f1fc);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      GetBitcoinUtxoList();
      GetBitcoinOption();
      in_stack_fffffffffffffd20 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_69;
      in_stack_fffffffffffffd18 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_48;
      in_stack_fffffffffffffd10 = (AssertionResult *)(local_48 + 0x10);
      in_stack_fffffffffffffd08 = (bool *)&local_58;
      in_R9 = local_130;
      cfd::CoinSelection::SelectCoins
                (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                 in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd20);
      cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x25f2ec);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd20);
    }
  }
  else {
    testing::Message::Message(local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0xe6,
               "Expected: ret = exp_selection.SelectCoins( target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(), tx_fee, &select_value, &fee, &use_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_148,local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message((Message *)0x25f402);
  }
  local_160 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_88);
  local_164 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((char *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
             (char *)in_stack_fffffffffffffd20,(unsigned_long *)in_stack_fffffffffffffd18,
             (int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x25f4f7);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0xe8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message((Message *)0x25f554);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25f5ac);
  local_190 = cfd::core::Amount::GetSatoshiValue((Amount *)(local_48 + 0x10));
  local_194 = 0xdf84758;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
             (char *)in_stack_fffffffffffffd20,(long *)in_stack_fffffffffffffd18,
             (int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x25f66e);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0xe9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message((Message *)0x25f6cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25f723);
  local_1c0 = cfd::core::Amount::GetSatoshiValue((Amount *)local_48);
  local_1c4 = 0xe10;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
             (char *)in_stack_fffffffffffffd20,(long *)in_stack_fffffffffffffd18,
             (int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x25f7e5);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message((Message *)0x25f842);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25f89a);
  sVar3 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_88);
  if (sVar3 == 2) {
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_88,0);
    local_1f0 = 0x9502f90;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              ((char *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
               (char *)in_stack_fffffffffffffd20,(unsigned_long *)in_stack_fffffffffffffd18,
               (long *)in_stack_fffffffffffffd10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
    if (!bVar1) {
      testing::Message::Message(&local_1f8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x25f963);
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0xec,pcVar2);
      testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      testing::Message::~Message((Message *)0x25f9c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x25fa15);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_88,1);
    local_218 = 0x4a817c8;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              ((char *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
               (char *)in_stack_fffffffffffffd20,(unsigned_long *)in_stack_fffffffffffffd18,
               (long *)in_stack_fffffffffffffd10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
    if (!bVar1) {
      testing::Message::Message(&local_220);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x25fac8);
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0xed,pcVar2);
      testing::internal::AssertHelper::operator=(&local_228,&local_220);
      testing::internal::AssertHelper::~AssertHelper(&local_228);
      testing::Message::~Message((Message *)0x25fb25);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x25fb7a);
  }
  local_239 = ~local_69[0] & 1;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,(type *)0x25fbb9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_270,(internal *)&local_238,(AssertionResult *)"use_bnb","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0xef,pcVar2);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    testing::Message::~Message((Message *)0x25fc9f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25fd17);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd20);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(220000000);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(),
      tx_fee, &select_value, &fee, &use_bnb));

  EXPECT_EQ(ret.size(), 2);
  EXPECT_EQ(select_value.GetSatoshiValue(), 234375000);
  EXPECT_EQ(fee.GetSatoshiValue(), 3600);
  if (ret.size() == 2) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(156250000));
    EXPECT_EQ(ret[1].amount, static_cast<int64_t>(78125000));
  }
  EXPECT_FALSE(use_bnb);
}